

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

bool __thiscall
file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::read_file(file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_contents)

{
  int iVar1;
  AssertionHandler local_98;
  undefined **local_50;
  undefined1 local_48;
  undefined1 local_47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  
  local_98.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_98.m_assertionInfo.macroName.m_size = 7;
  local_98.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/tests/tests.cpp";
  local_98.m_assertionInfo.lineInfo.line = 0x48e;
  local_98.m_assertionInfo.capturedExpression.m_start = "name == \"what\"";
  local_98.m_assertionInfo.capturedExpression.m_size = 0xe;
  local_98.m_assertionInfo.resultDisposition = Normal;
  local_98.m_reaction.shouldDebugBreak = false;
  local_98.m_reaction.shouldThrow = false;
  local_98.m_completed = false;
  local_98.m_resultCapture = Catch::getResultCapture();
  iVar1 = std::__cxx11::string::compare((char *)name);
  local_47 = iVar1 == 0;
  local_48 = 1;
  local_50 = &PTR_streamReconstructedExpression_002441d8;
  local_38 = "==";
  local_30 = 2;
  local_28 = "what";
  local_40 = name;
  (*(local_98.m_resultCapture)->_vptr_IResultCapture[10])();
  Catch::AssertionHandler::complete(&local_98);
  if (local_98.m_completed == false) {
    (*(local_98.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  std::__cxx11::string::_M_replace
            ((ulong)file_contents,0,(char *)file_contents->_M_string_length,0x20c226);
  return true;
}

Assistant:

bool read_file(const string_type& name, string_type& file_contents) const {
        // read from file [name].mustache (fake the data for the test)
        REQUIRE(name == "what");
        file_contents = "World";
        return true;
    }